

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsimd.c
# Opt level: O3

int jsimd_can_fdct_islow(void)

{
  uint uVar1;
  
  init_simd();
  uVar1 = 1;
  if (-1 < (char)simd_support) {
    uVar1 = (simd_support & 8) >> 3;
  }
  return uVar1;
}

Assistant:

GLOBAL(int)
jsimd_can_fdct_islow(void)
{
  init_simd();

  /* The code is optimised for these values only */
  if (DCTSIZE != 8)
    return 0;
  if (sizeof(DCTELEM) != 2)
    return 0;

  if ((simd_support & JSIMD_AVX2) && IS_ALIGNED_AVX(jconst_fdct_islow_avx2))
    return 1;
  if ((simd_support & JSIMD_SSE2) && IS_ALIGNED_SSE(jconst_fdct_islow_sse2))
    return 1;

  return 0;
}